

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O0

void __thiscall
OpenSteer::PolylineSegmentedPath::movePoints
          (PolylineSegmentedPath *this,size_type startIndex,size_type numOfPoints,Vec3 *newPoints)

{
  reference pvVar1;
  ulong uVar2;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  FloatContainer *in_RDI;
  Vec3 VVar3;
  size_type i;
  vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 isCyclic;
  reference in_stack_ffffffffffffff80;
  Vec3 *in_stack_ffffffffffffff88;
  Vec3Container *in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_28;
  
  for (local_28 = 0; isCyclic = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38),
      local_28 < in_RDX; local_28 = local_28 + 1) {
    in_stack_ffffffffffffff88 = (Vec3 *)(in_RCX + local_28 * 0xc);
    pvVar1 = std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::operator[]
                       ((vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *)
                        &(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_finish,in_RSI + local_28);
    Vec3::operator=(pvVar1,in_stack_ffffffffffffff88);
  }
  uVar2 = (**(code **)((in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 0xc))();
  if (((uVar2 & 1) != 0) && (in_RSI == 0)) {
    isCyclic = (undefined1)
               ((ulong)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish >> 0x38);
    in_stack_ffffffffffffff80 =
         std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::front
                   (in_stack_ffffffffffffff50);
    pvVar1 = std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::back
                       (in_stack_ffffffffffffff50);
    VVar3 = Vec3::operator=(pvVar1,in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff98 = VVar3._0_8_;
    in_stack_ffffffffffffffa0 = VVar3.z;
  }
  (**(code **)((in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + 0xc))();
  anon_unknown.dwarf_aa265::updateTangentsAndLengths
            ((Vec3Container *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_RDI,(size_type)in_stack_ffffffffffffff88,
             (size_type)in_stack_ffffffffffffff80,(bool)isCyclic);
  return;
}

Assistant:

void 
OpenSteer::PolylineSegmentedPath::movePoints( size_type startIndex,
                                              size_type numOfPoints,
                                              Vec3 const newPoints[] )
{
    assert( ( startIndex < ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "startIndex must be inside index range." );
    assert( ( ( startIndex + numOfPoints ) <= ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "The max. index of a point to set must be inside the index range." ); 
    
    // Update the point positions.
    // @todo Remove this line size_type const pathPointCount = pointCount();
    for ( size_type i = 0; i < numOfPoints; ++i ) {
        points_[ startIndex + i ] = newPoints[ i ];
    }
    
    // If the first point is changed and the path is cyclic also change the
    // last point, which is just a copy of the first point.
    if ( isCyclic() && ( 0 == startIndex ) ) {
        points_.back() = points_.front();
    }
    
    // Recalculate the tangents and lengths.
    updateTangentsAndLengths( points_, 
                              segmentTangents_, 
                              segmentLengths_, 
                              startIndex, 
                              numOfPoints, 
                              isCyclic() );
    
    
    assert( adjacentPathPointsDifferent( points_.begin(), points_.end(), isCyclic() ) && "Adjacent path points must be different." );
}